

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O0

void anon_unknown.dwarf_251e::modtest(int base,int test)

{
  bool bVar1;
  clock_t cVar2;
  clock_t cVar3;
  pointer pBVar4;
  reference pBVar5;
  reference pBVar6;
  float local_234;
  float local_21c;
  bool local_201;
  float diviser;
  float t2;
  BN local_1e0;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_1c8;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_1c0;
  iterator k_1;
  iterator j_1;
  iterator i_2;
  float t1;
  BN local_188;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_170;
  __normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_> local_168;
  iterator k;
  iterator j;
  iterator i_1;
  BN local_130;
  byte local_112;
  byte local_111;
  BN local_110;
  byte local_f1;
  BN local_f0;
  BN local_d8;
  undefined1 local_c0 [8];
  BN m;
  BN local_80;
  int local_64;
  undefined1 local_60 [4];
  int i;
  vector<BN,_std::allocator<BN>_> mod;
  vector<BN,_std::allocator<BN>_> exp;
  vector<BN,_std::allocator<BN>_> g;
  uint64_t t;
  int test_local;
  int base_local;
  
  std::vector<BN,_std::allocator<BN>_>::vector
            ((vector<BN,_std::allocator<BN>_> *)
             &exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<BN,_std::allocator<BN>_>::vector
            ((vector<BN,_std::allocator<BN>_> *)
             &mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<BN,_std::allocator<BN>_>::vector((vector<BN,_std::allocator<BN>_> *)local_60);
  for (local_64 = 0; local_64 < test; local_64 = local_64 + 1) {
    BN::makeRandom(&local_80,(long)base);
    std::vector<BN,_std::allocator<BN>_>::push_back
              ((vector<BN,_std::allocator<BN>_> *)
               &exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,&local_80);
    BN::~BN(&local_80);
    BN::makeRandom((BN *)&m.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(long)base);
    std::vector<BN,_std::allocator<BN>_>::push_back
              ((vector<BN,_std::allocator<BN>_> *)
               &mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,
               (value_type *)
               &m.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    BN::~BN((BN *)&m.ba.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    BN::makeRandom((BN *)local_c0,(long)base);
    while( true ) {
      bVar1 = BN::is0((BN *)local_c0);
      local_f1 = 0;
      local_111 = 0;
      local_112 = 0;
      local_201 = true;
      if (!bVar1) {
        BN::BN(&local_f0,(BN *)local_c0);
        local_f1 = 1;
        BN::BN(&local_110,0x10000);
        local_111 = 1;
        gcdBinary(&local_d8,&local_f0,&local_110);
        local_112 = 1;
        BN::BN(&local_130,1);
        local_201 = BN::operator!=(&local_d8,&local_130);
        BN::~BN(&local_130);
      }
      if ((local_112 & 1) != 0) {
        BN::~BN(&local_d8);
      }
      if ((local_111 & 1) != 0) {
        BN::~BN(&local_110);
      }
      if ((local_f1 & 1) != 0) {
        BN::~BN(&local_f0);
      }
      if (local_201 == false) break;
      BN::makeRandom((BN *)&i_1,(long)base);
      BN::operator=((BN *)local_c0,(BN *)&i_1);
      BN::~BN((BN *)&i_1);
    }
    std::vector<BN,_std::allocator<BN>_>::push_back
              ((vector<BN,_std::allocator<BN>_> *)local_60,(value_type *)local_c0);
    BN::~BN((BN *)local_c0);
  }
  cVar2 = clock();
  j = std::vector<BN,_std::allocator<BN>_>::begin
                ((vector<BN,_std::allocator<BN>_> *)
                 &exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
  k = std::vector<BN,_std::allocator<BN>_>::begin
                ((vector<BN,_std::allocator<BN>_> *)
                 &mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage);
  local_168._M_current =
       (BN *)std::vector<BN,_std::allocator<BN>_>::begin
                       ((vector<BN,_std::allocator<BN>_> *)local_60);
  while( true ) {
    local_170._M_current =
         (BN *)std::vector<BN,_std::allocator<BN>_>::end
                         ((vector<BN,_std::allocator<BN>_> *)
                          &exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&j,&local_170);
    if (!bVar1) break;
    pBVar4 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator->
                       (&j);
    pBVar5 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator*
                       (&k);
    pBVar6 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator*
                       (&local_168);
    BN::PowMod(&local_188,pBVar4,pBVar5,pBVar6);
    BN::~BN(&local_188);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++(&j,0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++(&k,0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++
              (&local_168,0);
  }
  cVar3 = clock();
  local_21c = (float)(ulong)(cVar3 - cVar2);
  cVar2 = clock();
  j_1 = std::vector<BN,_std::allocator<BN>_>::begin
                  ((vector<BN,_std::allocator<BN>_> *)
                   &exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
  k_1 = std::vector<BN,_std::allocator<BN>_>::begin
                  ((vector<BN,_std::allocator<BN>_> *)
                   &mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage);
  local_1c0._M_current =
       (BN *)std::vector<BN,_std::allocator<BN>_>::begin
                       ((vector<BN,_std::allocator<BN>_> *)local_60);
  while( true ) {
    local_1c8._M_current =
         (BN *)std::vector<BN,_std::allocator<BN>_>::end
                         ((vector<BN,_std::allocator<BN>_> *)
                          &exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&j_1,&local_1c8);
    if (!bVar1) break;
    pBVar4 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator->
                       (&j_1);
    pBVar5 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator*
                       (&k_1);
    pBVar6 = __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator*
                       (&local_1c0);
    BN::PowModBarrett(&local_1e0,pBVar4,pBVar5,pBVar6);
    BN::~BN(&local_1e0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++(&j_1,0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++(&k_1,0);
    __gnu_cxx::__normal_iterator<BN_*,_std::vector<BN,_std::allocator<BN>_>_>::operator++
              (&local_1c0,0);
  }
  cVar3 = clock();
  local_234 = (float)(ulong)(cVar3 - cVar2);
  printf("%d\t%d\t%d\t%.2f\t\t%.2f\n",(double)(local_21c / ((float)test * 1000.0)),
         (double)(local_234 / ((float)test * 1000.0)),(ulong)(uint)base,(ulong)(uint)(base << 3),
         (ulong)(uint)test);
  std::vector<BN,_std::allocator<BN>_>::~vector((vector<BN,_std::allocator<BN>_> *)local_60);
  std::vector<BN,_std::allocator<BN>_>::~vector
            ((vector<BN,_std::allocator<BN>_> *)
             &mod.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<BN,_std::allocator<BN>_>::~vector
            ((vector<BN,_std::allocator<BN>_> *)
             &exp.super__Vector_base<BN,_std::allocator<BN>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return;
}

Assistant:

void modtest(int base,int test) {
    uint64_t t;
    vector <BN> g;
    vector <BN> exp;
    vector <BN> mod;


    for(int i=0;i<test;i++) {
        g.push_back(BN::makeRandom(base));
        exp.push_back(BN::makeRandom(base));
        BN m(BN::makeRandom(base));
        while (m.is0() || (gcdBinary(m, (BN)bsize) != (BN) 1))
            m = BN::makeRandom(base);
        mod.push_back( m );
    }

    t = clock();
    for(vector <BN> :: iterator i = g.begin(), j = exp.begin(), k = mod.begin(); i != g.end(); i++, j++, k++)
        i->PowMod(*j, *k);
    float t1 = clock() - t;

    t = clock();
    for(vector <BN> :: iterator i = g.begin(), j = exp.begin(), k = mod.begin(); i != g.end(); i++, j++, k++)
        i->PowModBarrett(*j, *k);
    float t2 = clock() - t;

    float diviser = 1000.0 * test;
    t1 /= diviser;
    t2 /= diviser;

    printf("%d\t%d\t%d\t%.2f\t\t%.2f\n",base,(int)(base*8),test, t1, t2);
}